

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.cpp
# Opt level: O2

size_t __thiscall adios2::IO::AddTransport(IO *this,string *type,Params *parameters)

{
  IO *pIVar1;
  size_t sVar2;
  allocator local_61;
  string local_60;
  string local_40 [32];
  
  pIVar1 = this->m_IO;
  std::__cxx11::string::string((string *)&local_60,"in call to IO::AddTransport",&local_61);
  helper::CheckForNullptr<adios2::core::IO>(pIVar1,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  pIVar1 = this->m_IO;
  std::__cxx11::string::string(local_40,(string *)type);
  sVar2 = adios2::core::IO::AddTransport(pIVar1,local_40,parameters);
  std::__cxx11::string::~string(local_40);
  return sVar2;
}

Assistant:

size_t IO::AddTransport(const std::string type, const Params &parameters)
{
    helper::CheckForNullptr(m_IO, "in call to IO::AddTransport");
    return m_IO->AddTransport(type, parameters);
}